

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

char * al_get_config_value(ALLEGRO_CONFIG *config,char *section,char *key)

{
  ALLEGRO_USTR *section_00;
  ALLEGRO_USTR *key_00;
  ALLEGRO_CONFIG_SECTION *section_01;
  ALLEGRO_CONFIG_ENTRY *pAVar1;
  char *pcVar2;
  ALLEGRO_USTR_INFO key_info;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR_INFO AStack_38;
  ALLEGRO_USTR_INFO local_28;
  
  if (section == (char *)0x0) {
    section = "";
  }
  section_00 = al_ref_cstr(&local_28,section);
  key_00 = al_ref_cstr(&AStack_38,key);
  section_01 = find_section(config,section_00);
  if ((section_01 != (ALLEGRO_CONFIG_SECTION *)0x0) &&
     (pAVar1 = find_entry(section_01,key_00), pAVar1 != (ALLEGRO_CONFIG_ENTRY *)0x0)) {
    pcVar2 = al_cstr(pAVar1->value);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

const char *al_get_config_value(const ALLEGRO_CONFIG *config,
   const char *section, const char *key)
{
   ALLEGRO_USTR_INFO section_info;
   ALLEGRO_USTR_INFO key_info;
   const ALLEGRO_USTR *usection;
   const ALLEGRO_USTR *ukey;
   const ALLEGRO_USTR *value;

   if (section == NULL) {
      section = "";
   }

   usection = al_ref_cstr(&section_info, section);
   ukey = al_ref_cstr(&key_info, key);

   if (config_get_value(config, usection, ukey, &value))
      return al_cstr(value);
   else
      return NULL;
}